

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O1

int __thiscall
lossless_neural_sound::expression_compiler::expression::Expression_node::structurally_compare
          (Expression_node *this,Expression_node *rt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  if (this != rt) {
    sVar2 = get_tree_index(this);
    sVar3 = get_tree_index(rt);
    uVar1 = 0xffffffff;
    if (sVar3 <= sVar2) {
      uVar1 = (uint)(sVar3 < sVar2);
    }
    return uVar1;
  }
  return 0;
}

Assistant:

int structurally_compare(const Expression_node *rt) const noexcept
    {
        if(this == rt)
            return 0;
        auto my_tree_index = get_tree_index();
        auto rt_tree_index = rt->get_tree_index();
        if(my_tree_index < rt_tree_index)
            return -1;
        if(my_tree_index > rt_tree_index)
            return 1;
        return 0;
    }